

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int runC(lua_State *L,lua_State *L1,char *pc)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  lua_CFunction p_Var7;
  char *pcVar8;
  char *r;
  lua_Integer lVar9;
  ulong uVar10;
  void *pvVar11;
  lua_State *L_00;
  undefined8 uVar13;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  lua_State *local_590;
  lua_State *local_588;
  int local_26c;
  int i_7;
  int nres_4;
  int n_2;
  lua_State *ts;
  lua_State *fs;
  int t_6;
  int f_1;
  char *s1;
  char *s_1;
  int i_6;
  int count;
  int mask;
  int t_5;
  int i_5;
  int i_4;
  int n_1;
  int i_3;
  int t_4;
  int t_3;
  int t_2;
  char *msg_1;
  int n;
  int i_2;
  int nres_3;
  int narg_3;
  int nres_2;
  int narg_2;
  char *s;
  int c;
  int b_1;
  int a_1;
  int t_1;
  lua_CFunction func;
  int f;
  int b;
  int a;
  int op_1;
  char *opt;
  char *msg;
  int sz;
  int i_1;
  int nres_1;
  int narg_1;
  int nres;
  int narg;
  int op;
  int i;
  int t;
  char *inst;
  char local_158 [4];
  int status;
  char buff [300];
  char *pc_local;
  lua_State *L1_local;
  lua_State *L_local;
  
  inst._4_4_ = 0;
  unique0x10002116 = pc;
  if (pc == (char *)0x0) {
    L_local._4_4_ = luaL_error(L,"attempt to runC null script");
  }
  else {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          while( true ) {
                            while( true ) {
                              while( true ) {
                                while( true ) {
                                  while( true ) {
                                    while( true ) {
                                      while( true ) {
                                        while( true ) {
                                          while( true ) {
                                            while( true ) {
                                              while( true ) {
                                                while( true ) {
                                                  while( true ) {
                                                    while( true ) {
                                                      while( true ) {
                                                        while( true ) {
                                                          while( true ) {
                                                            while( true ) {
                                                              while( true ) {
                                                                while( true ) {
                                                                  while( true ) {
                                                                    while( true ) {
                                                                      while( true ) {
                                                                        while( true ) {
                                                                          while( true ) {
                                                                            while( true ) {
                                                                              while( true ) {
                                                                                while( true ) {
                                                                                  while( true ) {
                                                                                    while( true ) {
                                                                                      while( true )
                                                                                      {
                                                                                        while( true 
                                                  ) {
                                                    while( true ) {
                                                      while( true ) {
                                                        while( true ) {
                                                          while( true ) {
                                                            while( true ) {
                                                              while( true ) {
                                                                while( true ) {
                                                                  while( true ) {
                                                                    while( true ) {
                                                                      while( true ) {
                                                                        while( true ) {
                                                                          while( true ) {
                                                                            while( true ) {
                                                                              while( true ) {
                                                                                while( true ) {
                                                                                  while( true ) {
                                                                                    while( true ) {
                                                                                      pcVar5 = 
                                                  getstring_aux(L,local_158,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = strcmp("",pcVar5);
                                                  if (iVar2 == 0) {
                                                    return 0;
                                                  }
                                                  iVar2 = strcmp("absindex",pcVar5);
                                                  uVar13 = in_ZMM0._8_8_;
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_absindex(L1,iVar2);
                                                  in_ZMM0 = ZEXT1664(CONCAT88(uVar13,(double)iVar2))
                                                  ;
                                                  lua_pushnumber(L1,(double)iVar2);
                                                  }
                                                  iVar2 = strcmp("append",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  sVar6 = lua_rawlen(L1,iVar2);
                                                  lua_rawseti(L1,iVar2,(long)((int)sVar6 + 1));
                                                  }
                                                  iVar2 = strcmp("arith",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  skip((char **)(buff + 0x128));
                                                  cVar1 = *stack0xffffffffffffffd8;
                                                  unique0x10002106 = stack0xffffffffffffffd8 + 1;
                                                  pcVar5 = strchr("+-*%^/\\&|~<>_!",(int)cVar1);
                                                  lua_arith(L1,(int)pcVar5 + -0x19eaa8);
                                                  }
                                                  iVar2 = strcmp("call",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  lua_callk(L1,iVar2,iVar3,0,(lua_KFunction)0x0);
                                                  }
                                                  iVar2 = strcmp("callk",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar4 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  lua_callk(L1,iVar2,iVar3,(long)iVar4,Cfunck);
                                                  }
                                                  iVar2 = strcmp("checkstack",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  opt = getstring_aux(L,local_158,
                                                                      (char **)(buff + 0x128));
                                                  if (*opt == '\0') {
                                                    opt = (char *)0x0;
                                                  }
                                                  luaL_checkstack(L1,iVar2,opt);
                                                  }
                                                  iVar2 = strcmp("compare",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  pcVar5 = getstring_aux(L,local_158,
                                                                         (char **)(buff + 0x128));
                                                  if (*pcVar5 == 'E') {
                                                    local_26c = 0;
                                                  }
                                                  else {
                                                    local_26c = 2;
                                                    if (pcVar5[1] == 'T') {
                                                      local_26c = 1;
                                                    }
                                                  }
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar3 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_compare(L1,iVar2,iVar3,local_26c);
                                                  lua_pushboolean(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("concat",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  lua_concat(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("copy",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar3 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  lua_copy(L1,iVar2,iVar3);
                                                  }
                                                  iVar2 = strcmp("func2num",pcVar5);
                                                  auVar12 = in_ZMM0._0_16_;
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  p_Var7 = lua_tocfunction(L1,iVar2);
                                                  auVar12 = vcvtusi2sd_avx512f(auVar12,p_Var7);
                                                  in_ZMM0 = ZEXT1664(auVar12);
                                                  lua_pushnumber(L1,auVar12._0_8_);
                                                  }
                                                  iVar2 = strcmp("getfield",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  pcVar5 = getstring_aux(L,local_158,
                                                                         (char **)(buff + 0x128));
                                                  lua_getfield(L1,iVar2,pcVar5);
                                                  }
                                                  iVar2 = strcmp("getglobal",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  pcVar5 = getstring_aux(L,local_158,
                                                                         (char **)(buff + 0x128));
                                                  lua_getglobal(L1,pcVar5);
                                                  }
                                                  iVar2 = strcmp("getmetatable",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_getmetatable(L1,iVar2);
                                                  if (iVar2 == 0) {
                                                    lua_pushnil(L1);
                                                  }
                                                  }
                                                  iVar2 = strcmp("gettable",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  lua_gettable(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("gettop",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = lua_gettop(L1);
                                                  lua_pushinteger(L1,(long)iVar2);
                                                  }
                                                  iVar2 = strcmp("gsub",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar4 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  pcVar5 = lua_tolstring(L1,iVar2,(size_t *)0x0);
                                                  pcVar8 = lua_tolstring(L1,iVar3,(size_t *)0x0);
                                                  r = lua_tolstring(L1,iVar4,(size_t *)0x0);
                                                  luaL_gsub(L1,pcVar5,pcVar8,r);
                                                  }
                                                  iVar2 = strcmp("insert",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  lua_rotate(L1,iVar2,1);
                                                  }
                                                  iVar2 = strcmp("iscfunction",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_iscfunction(L1,iVar2);
                                                  lua_pushboolean(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("isfunction",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_type(L1,iVar2);
                                                  lua_pushboolean(L1,(uint)(iVar2 == 6));
                                                  }
                                                  iVar2 = strcmp("isnil",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_type(L1,iVar2);
                                                  lua_pushboolean(L1,(uint)(iVar2 == 0));
                                                  }
                                                  iVar2 = strcmp("isnull",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_type(L1,iVar2);
                                                  lua_pushboolean(L1,(uint)(iVar2 == -1));
                                                  }
                                                  iVar2 = strcmp("isnumber",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_isnumber(L1,iVar2);
                                                  lua_pushboolean(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("isstring",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_isstring(L1,iVar2);
                                                  lua_pushboolean(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("istable",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_type(L1,iVar2);
                                                  lua_pushboolean(L1,(uint)(iVar2 == 5));
                                                  }
                                                  iVar2 = strcmp("isudataval",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_type(L1,iVar2);
                                                  lua_pushboolean(L1,(uint)(iVar2 == 2));
                                                  }
                                                  iVar2 = strcmp("isuserdata",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  iVar2 = lua_isuserdata(L1,iVar2);
                                                  lua_pushboolean(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("len",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  lua_len(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("Llen",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  lVar9 = luaL_len(L1,iVar2);
                                                  lua_pushinteger(L1,lVar9);
                                                  }
                                                  iVar2 = strcmp("loadfile",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  pcVar5 = luaL_checklstring(L1,iVar2,(size_t *)0x0)
                                                  ;
                                                  luaL_loadfilex(L1,pcVar5,(char *)0x0);
                                                  }
                                                  iVar2 = strcmp("loadstring",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  pcVar5 = luaL_checklstring(L1,iVar2,(size_t *)0x0)
                                                  ;
                                                  luaL_loadstring(L1,pcVar5);
                                                  }
                                                  iVar2 = strcmp("newmetatable",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  pcVar5 = getstring_aux(L,local_158,
                                                                         (char **)(buff + 0x128));
                                                  iVar2 = luaL_newmetatable(L1,pcVar5);
                                                  lua_pushboolean(L1,iVar2);
                                                  }
                                                  iVar2 = strcmp("newtable",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  lua_createtable(L1,0,0);
                                                  }
                                                  iVar2 = strcmp("newthread",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  lua_newthread(L1);
                                                  }
                                                  iVar2 = strcmp("newuserdata",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  lua_newuserdata(L1,(long)iVar2);
                                                  }
                                                  iVar2 = strcmp("next",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  lua_next(L1,-2);
                                                  }
                                                  iVar2 = strcmp("objsize",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  sVar6 = lua_rawlen(L1,iVar2);
                                                  lua_pushinteger(L1,sVar6);
                                                  }
                                                  iVar2 = strcmp("pcall",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar4 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  inst._4_4_ = lua_pcallk(L1,iVar2,iVar3,iVar4,0,
                                                                          (lua_KFunction)0x0);
                                                  }
                                                  iVar2 = strcmp("pcallk",pcVar5);
                                                  if (iVar2 != 0) break;
                                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                  iVar4 = getindex_aux(L,L1,(char **)(buff + 0x128))
                                                  ;
                                                  inst._4_4_ = lua_pcallk(L1,iVar2,iVar3,0,
                                                                          (long)iVar4,Cfunck);
                                                }
                                                iVar2 = strcmp("pop",pcVar5);
                                                if (iVar2 != 0) break;
                                                iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                                lua_settop(L1,-1 - iVar2);
                                              }
                                              iVar2 = strcmp("printstack",pcVar5);
                                              if (iVar2 != 0) break;
                                              iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                              if (iVar2 == 0) {
                                                printstack(L1);
                                              }
                                              else {
                                                pcVar5 = luaL_tolstring(L1,iVar2,(size_t *)0x0);
                                                printf("%s\n",pcVar5);
                                                lua_settop(L1,-2);
                                              }
                                            }
                                            iVar2 = strcmp("print",pcVar5);
                                            if (iVar2 != 0) break;
                                            pcVar5 = getstring_aux(L,local_158,
                                                                   (char **)(buff + 0x128));
                                            printf("%s\n",pcVar5);
                                          }
                                          iVar2 = strcmp("pushbool",pcVar5);
                                          if (iVar2 != 0) break;
                                          iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                          lua_pushboolean(L1,iVar2);
                                        }
                                        iVar2 = strcmp("pushcclosure",pcVar5);
                                        if (iVar2 != 0) break;
                                        iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                        lua_pushcclosure(L1,testC,iVar2);
                                      }
                                      iVar2 = strcmp("pushint",pcVar5);
                                      if (iVar2 != 0) break;
                                      iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                      lua_pushinteger(L1,(long)iVar2);
                                    }
                                    iVar2 = strcmp("pushnil",pcVar5);
                                    if (iVar2 != 0) break;
                                    lua_pushnil(L1);
                                  }
                                  iVar2 = strcmp("pushnum",pcVar5);
                                  uVar13 = in_ZMM0._8_8_;
                                  if (iVar2 != 0) break;
                                  iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                  in_ZMM0 = ZEXT1664(CONCAT88(uVar13,(double)iVar2));
                                  lua_pushnumber(L1,(double)iVar2);
                                }
                                iVar2 = strcmp("pushstatus",pcVar5);
                                if (iVar2 != 0) break;
                                pushcode(L1,inst._4_4_);
                              }
                              iVar2 = strcmp("pushstring",pcVar5);
                              if (iVar2 != 0) break;
                              pcVar5 = getstring_aux(L,local_158,(char **)(buff + 0x128));
                              lua_pushstring(L1,pcVar5);
                            }
                            iVar2 = strcmp("pushupvalueindex",pcVar5);
                            if (iVar2 != 0) break;
                            iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                            lua_pushinteger(L1,(long)(-0xf4628 - iVar2));
                          }
                          iVar2 = strcmp("pushvalue",pcVar5);
                          if (iVar2 != 0) break;
                          iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                          lua_pushvalue(L1,iVar2);
                        }
                        iVar2 = strcmp("pushfstringI",pcVar5);
                        if (iVar2 != 0) break;
                        pcVar5 = lua_tolstring(L,-2,(size_t *)0x0);
                        uVar10 = lua_tointegerx(L,-1,(int *)0x0);
                        lua_pushfstring(L1,pcVar5,uVar10 & 0xffffffff);
                      }
                      iVar2 = strcmp("pushfstringS",pcVar5);
                      if (iVar2 != 0) break;
                      pcVar5 = lua_tolstring(L,-2,(size_t *)0x0);
                      pcVar8 = lua_tolstring(L,-1,(size_t *)0x0);
                      lua_pushfstring(L1,pcVar5,pcVar8);
                    }
                    iVar2 = strcmp("pushfstringP",pcVar5);
                    if (iVar2 != 0) break;
                    pcVar5 = lua_tolstring(L,-2,(size_t *)0x0);
                    pvVar11 = lua_topointer(L,-1);
                    lua_pushfstring(L1,pcVar5,pvVar11);
                  }
                  iVar2 = strcmp("rawgeti",pcVar5);
                  if (iVar2 != 0) break;
                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                  iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
                  lua_rawgeti(L1,iVar2,(long)iVar3);
                }
                iVar2 = strcmp("rawgetp",pcVar5);
                if (iVar2 != 0) break;
                iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
                lua_rawgetp(L1,iVar2,(void *)(long)iVar3);
              }
              iVar2 = strcmp("rawsetp",pcVar5);
              if (iVar2 != 0) break;
              iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
              iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
              lua_rawsetp(L1,iVar2,(void *)(long)iVar3);
            }
            iVar2 = strcmp("remove",pcVar5);
            if (iVar2 != 0) break;
            iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
            lua_rotate(L1,iVar2,-1);
            lua_settop(L1,-2);
          }
          iVar2 = strcmp("replace",pcVar5);
          if (iVar2 != 0) break;
          iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
          lua_copy(L1,-1,iVar2);
          lua_settop(L1,-2);
        }
        iVar2 = strcmp("resume",pcVar5);
        if (iVar2 != 0) break;
        iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
        L_00 = lua_tothread(L1,iVar2);
        iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
        inst._4_4_ = lua_resume(L_00,L,iVar2);
      }
      iVar2 = strcmp("return",pcVar5);
      if (iVar2 == 0) break;
      iVar2 = strcmp("rotate",pcVar5);
      if (iVar2 == 0) {
        iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
        iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
        lua_rotate(L1,iVar2,iVar3);
      }
      else {
        iVar2 = strcmp("setfield",pcVar5);
        if (iVar2 == 0) {
          iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
          pcVar5 = getstring_aux(L,local_158,(char **)(buff + 0x128));
          lua_setfield(L1,iVar2,pcVar5);
        }
        else {
          iVar2 = strcmp("setglobal",pcVar5);
          if (iVar2 == 0) {
            pcVar5 = getstring_aux(L,local_158,(char **)(buff + 0x128));
            lua_setglobal(L1,pcVar5);
          }
          else {
            iVar2 = strcmp("sethook",pcVar5);
            if (iVar2 == 0) {
              iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
              iVar3 = getnum_aux(L,L1,(char **)(buff + 0x128));
              pcVar5 = getstring_aux(L,local_158,(char **)(buff + 0x128));
              sethookaux(L1,iVar2,iVar3,pcVar5);
            }
            else {
              iVar2 = strcmp("setmetatable",pcVar5);
              if (iVar2 == 0) {
                iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                lua_setmetatable(L1,iVar2);
              }
              else {
                iVar2 = strcmp("settable",pcVar5);
                if (iVar2 == 0) {
                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                  lua_settable(L1,iVar2);
                }
                else {
                  iVar2 = strcmp("settop",pcVar5);
                  if (iVar2 == 0) {
                    iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                    lua_settop(L1,iVar2);
                  }
                  else {
                    iVar2 = strcmp("testudata",pcVar5);
                    if (iVar2 == 0) {
                      iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                      pcVar5 = getstring_aux(L,local_158,(char **)(buff + 0x128));
                      pvVar11 = luaL_testudata(L1,iVar2,pcVar5);
                      lua_pushboolean(L1,(uint)(pvVar11 != (void *)0x0));
                    }
                    else {
                      iVar2 = strcmp("error",pcVar5);
                      if (iVar2 == 0) {
                        lua_error(L1);
                      }
                      else {
                        iVar2 = strcmp("abort",pcVar5);
                        if (iVar2 == 0) {
                          abort();
                        }
                        iVar2 = strcmp("throw",pcVar5);
                        if (iVar2 == 0) {
                          luaL_error(L1,"C++");
                          return 0;
                        }
                        iVar2 = strcmp("tobool",pcVar5);
                        if (iVar2 == 0) {
                          iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                          iVar2 = lua_toboolean(L1,iVar2);
                          lua_pushboolean(L1,iVar2);
                        }
                        else {
                          iVar2 = strcmp("tocfunction",pcVar5);
                          if (iVar2 == 0) {
                            iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                            p_Var7 = lua_tocfunction(L1,iVar2);
                            lua_pushcclosure(L1,p_Var7,0);
                          }
                          else {
                            iVar2 = strcmp("tointeger",pcVar5);
                            if (iVar2 == 0) {
                              iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                              lVar9 = lua_tointegerx(L1,iVar2,(int *)0x0);
                              lua_pushinteger(L1,lVar9);
                            }
                            else {
                              iVar2 = strcmp("tonumber",pcVar5);
                              if (iVar2 == 0) {
                                iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                                in_ZMM0._0_8_ = lua_tonumberx(L1,iVar2,(int *)0x0);
                                in_ZMM0._8_56_ = extraout_var;
                                lua_pushnumber(L1,in_ZMM0._0_8_);
                              }
                              else {
                                iVar2 = strcmp("topointer",pcVar5);
                                auVar12 = in_ZMM0._0_16_;
                                if (iVar2 == 0) {
                                  iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                                  pvVar11 = lua_topointer(L1,iVar2);
                                  auVar12 = vcvtusi2sd_avx512f(auVar12,pvVar11);
                                  in_ZMM0 = ZEXT1664(auVar12);
                                  lua_pushnumber(L1,auVar12._0_8_);
                                }
                                else {
                                  iVar2 = strcmp("tostring",pcVar5);
                                  if (iVar2 == 0) {
                                    iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                                    pcVar5 = lua_tolstring(L1,iVar2,(size_t *)0x0);
                                    pcVar8 = lua_pushstring(L1,pcVar5);
                                    if (((pcVar5 != (char *)0x0) || (pcVar8 != (char *)0x0)) &&
                                       (iVar2 = strcmp(pcVar5,pcVar8), iVar2 != 0)) {
                                      __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                                                  ,0x5f3,
                                                  "int runC(lua_State *, lua_State *, const char *)"
                                                  );
                                    }
                                  }
                                  else {
                                    iVar2 = strcmp("type",pcVar5);
                                    if (iVar2 == 0) {
                                      iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                      iVar2 = lua_type(L1,iVar2);
                                      pcVar5 = lua_typename(L1,iVar2);
                                      lua_pushstring(L1,pcVar5);
                                    }
                                    else {
                                      iVar2 = strcmp("xmove",pcVar5);
                                      if (iVar2 == 0) {
                                        iVar2 = getindex_aux(L,L1,(char **)(buff + 0x128));
                                        iVar3 = getindex_aux(L,L1,(char **)(buff + 0x128));
                                        local_588 = L1;
                                        if (iVar2 != 0) {
                                          local_588 = lua_tothread(L1,iVar2);
                                        }
                                        local_590 = L1;
                                        if (iVar3 != 0) {
                                          local_590 = lua_tothread(L1,iVar3);
                                        }
                                        i_7 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                        if (i_7 == 0) {
                                          i_7 = lua_gettop(local_588);
                                        }
                                        lua_xmove(local_588,local_590,i_7);
                                      }
                                      else {
                                        iVar2 = strcmp("yield",pcVar5);
                                        if (iVar2 == 0) {
                                          iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                          iVar2 = lua_yieldk(L1,iVar2,0,(lua_KFunction)0x0);
                                          return iVar2;
                                        }
                                        iVar2 = strcmp("yieldk",pcVar5);
                                        if (iVar2 == 0) {
                                          iVar2 = getnum_aux(L,L1,(char **)(buff + 0x128));
                                          iVar3 = getindex_aux(L,L1,(char **)(buff + 0x128));
                                          iVar2 = lua_yieldk(L1,iVar2,(long)iVar3,Cfunck);
                                          return iVar2;
                                        }
                                        luaL_error(L,"unknown instruction %s",local_158);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    L_local._4_4_ = getnum_aux(L,L1,(char **)(buff + 0x128));
    if (L1 != L) {
      for (t_5 = 0; t_5 < L_local._4_4_; t_5 = t_5 + 1) {
        pcVar5 = lua_tolstring(L1,-(L_local._4_4_ - t_5),(size_t *)0x0);
        lua_pushstring(L,pcVar5);
      }
    }
  }
  return L_local._4_4_;
}

Assistant:

static int runC (lua_State *L, lua_State *L1, const char *pc) {
  char buff[300];
  int status = 0;
  if (pc == NULL) return luaL_error(L, "attempt to runC null script");
  for (;;) {
    const char *inst = getstring;
    if EQ("") return 0;
    else if EQ("absindex") {
      lua_pushnumber(L1, lua_absindex(L1, getindex));
    }
    else if EQ("append") {
      int t = getindex;
      int i = lua_rawlen(L1, t);
      lua_rawseti(L1, t, i + 1);
    }
    else if EQ("arith") {
      int op;
      skip(&pc);
      op = strchr(ops, *pc++) - ops;
      lua_arith(L1, op);
    }
    else if EQ("call") {
      int narg = getnum;
      int nres = getnum;
      lua_call(L1, narg, nres);
    }
    else if EQ("callk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      lua_callk(L1, narg, nres, i, Cfunck);
    }
    else if EQ("checkstack") {
      int sz = getnum;
      const char *msg = getstring;
      if (*msg == '\0')
        msg = NULL;  /* to test 'luaL_checkstack' with no message */
      luaL_checkstack(L1, sz, msg);
    }
    else if EQ("compare") {
      const char *opt = getstring;  /* EQ, LT, or LE */
      int op = (opt[0] == 'E') ? LUA_OPEQ
                               : (opt[1] == 'T') ? LUA_OPLT : LUA_OPLE;
      int a = getindex;
      int b = getindex;
      lua_pushboolean(L1, lua_compare(L1, a, b, op));
    }
    else if EQ("concat") {
      lua_concat(L1, getnum);
    }
    else if EQ("copy") {
      int f = getindex;
      lua_copy(L1, f, getindex);
    }
    else if EQ("func2num") {
      lua_CFunction func = lua_tocfunction(L1, getindex);
      lua_pushnumber(L1, cast(size_t, func));
    }
    else if EQ("getfield") {
      int t = getindex;
      lua_getfield(L1, t, getstring);
    }
    else if EQ("getglobal") {
      lua_getglobal(L1, getstring);
    }
    else if EQ("getmetatable") {
      if (lua_getmetatable(L1, getindex) == 0)
        lua_pushnil(L1);
    }
    else if EQ("gettable") {
      lua_gettable(L1, getindex);
    }
    else if EQ("gettop") {
      lua_pushinteger(L1, lua_gettop(L1));
    }
    else if EQ("gsub") {
      int a = getnum; int b = getnum; int c = getnum;
      luaL_gsub(L1, lua_tostring(L1, a),
                    lua_tostring(L1, b),
                    lua_tostring(L1, c));
    }
    else if EQ("insert") {
      lua_insert(L1, getnum);
    }
    else if EQ("iscfunction") {
      lua_pushboolean(L1, lua_iscfunction(L1, getindex));
    }
    else if EQ("isfunction") {
      lua_pushboolean(L1, lua_isfunction(L1, getindex));
    }
    else if EQ("isnil") {
      lua_pushboolean(L1, lua_isnil(L1, getindex));
    }
    else if EQ("isnull") {
      lua_pushboolean(L1, lua_isnone(L1, getindex));
    }
    else if EQ("isnumber") {
      lua_pushboolean(L1, lua_isnumber(L1, getindex));
    }
    else if EQ("isstring") {
      lua_pushboolean(L1, lua_isstring(L1, getindex));
    }
    else if EQ("istable") {
      lua_pushboolean(L1, lua_istable(L1, getindex));
    }
    else if EQ("isudataval") {
      lua_pushboolean(L1, lua_islightuserdata(L1, getindex));
    }
    else if EQ("isuserdata") {
      lua_pushboolean(L1, lua_isuserdata(L1, getindex));
    }
    else if EQ("len") {
      lua_len(L1, getindex);
    }
    else if EQ("Llen") {
      lua_pushinteger(L1, luaL_len(L1, getindex));
    }
    else if EQ("loadfile") {
      luaL_loadfile(L1, luaL_checkstring(L1, getnum));
    }
    else if EQ("loadstring") {
      const char *s = luaL_checkstring(L1, getnum);
      luaL_loadstring(L1, s);
    }
    else if EQ("newmetatable") {
      lua_pushboolean(L1, luaL_newmetatable(L1, getstring));
    }
    else if EQ("newtable") {
      lua_newtable(L1);
    }
    else if EQ("newthread") {
      lua_newthread(L1);
    }
    else if EQ("newuserdata") {
      lua_newuserdata(L1, getnum);
    }
    else if EQ("next") {
      lua_next(L1, -2);
    }
    else if EQ("objsize") {
      lua_pushinteger(L1, lua_rawlen(L1, getindex));
    }
    else if EQ("pcall") {
      int narg = getnum;
      int nres = getnum;
      status = lua_pcall(L1, narg, nres, getnum);
    }
    else if EQ("pcallk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      status = lua_pcallk(L1, narg, nres, 0, i, Cfunck);
    }
    else if EQ("pop") {
      lua_pop(L1, getnum);
    }
    else if EQ("printstack") {
      int n = getnum;
      if (n != 0) {
        printf("%s\n", luaL_tolstring(L1, n, NULL));
        lua_pop(L1, 1);
      }
      else printstack(L1);
    }
    else if EQ("print") {
      const char *msg = getstring;
      printf("%s\n", msg);
    }

    else if EQ("pushbool") {
      lua_pushboolean(L1, getnum);
    }
    else if EQ("pushcclosure") {
      lua_pushcclosure(L1, testC, getnum);
    }
    else if EQ("pushint") {
      lua_pushinteger(L1, getnum);
    }
    else if EQ("pushnil") {
      lua_pushnil(L1);
    }
    else if EQ("pushnum") {
      lua_pushnumber(L1, (lua_Number)getnum);
    }
    else if EQ("pushstatus") {
      pushcode(L1, status);
    }
    else if EQ("pushstring") {
      lua_pushstring(L1, getstring);
    }
    else if EQ("pushupvalueindex") {
      lua_pushinteger(L1, lua_upvalueindex(getnum));
    }
    else if EQ("pushvalue") {
      lua_pushvalue(L1, getindex);
    }
    else if EQ("pushfstringI") {
      lua_pushfstring(L1, lua_tostring(L, -2), (int)lua_tointeger(L, -1));
    }
    else if EQ("pushfstringS") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_tostring(L, -1));
    }
    else if EQ("pushfstringP") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_topointer(L, -1));
    }
    else if EQ("rawgeti") {
      int t = getindex;
      lua_rawgeti(L1, t, getnum);
    }
    else if EQ("rawgetp") {
      int t = getindex;
      lua_rawgetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("rawsetp") {
      int t = getindex;
      lua_rawsetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("remove") {
      lua_remove(L1, getnum);
    }
    else if EQ("replace") {
      lua_replace(L1, getindex);
    }
    else if EQ("resume") {
      int i = getindex;
      status = lua_resume(lua_tothread(L1, i), L, getnum);
    }
    else if EQ("return") {
      int n = getnum;
      if (L1 != L) {
        int i;
        for (i = 0; i < n; i++)
          lua_pushstring(L, lua_tostring(L1, -(n - i)));
      }
      return n;
    }
    else if EQ("rotate") {
      int i = getindex;
      lua_rotate(L1, i, getnum);
    }
    else if EQ("setfield") {
      int t = getindex;
      lua_setfield(L1, t, getstring);
    }
    else if EQ("setglobal") {
      lua_setglobal(L1, getstring);
    }
    else if EQ("sethook") {
      int mask = getnum;
      int count = getnum;
      sethookaux(L1, mask, count, getstring);
    }
    else if EQ("setmetatable") {
      lua_setmetatable(L1, getindex);
    }
    else if EQ("settable") {
      lua_settable(L1, getindex);
    }
    else if EQ("settop") {
      lua_settop(L1, getnum);
    }
    else if EQ("testudata") {
      int i = getindex;
      lua_pushboolean(L1, luaL_testudata(L1, i, getstring) != NULL);
    }
    else if EQ("error") {
      lua_error(L1);
    }
    else if EQ("abort") {
      abort();
    }
    else if EQ("throw") {
#if defined(__cplusplus)
static struct X { int x; } x;
      throw x;
#else
      luaL_error(L1, "C++");
#endif
      break;
    }
    else if EQ("tobool") {
      lua_pushboolean(L1, lua_toboolean(L1, getindex));
    }
    else if EQ("tocfunction") {
      lua_pushcfunction(L1, lua_tocfunction(L1, getindex));
    }
    else if EQ("tointeger") {
      lua_pushinteger(L1, lua_tointeger(L1, getindex));
    }
    else if EQ("tonumber") {
      lua_pushnumber(L1, lua_tonumber(L1, getindex));
    }
    else if EQ("topointer") {
      lua_pushnumber(L1, cast(size_t, lua_topointer(L1, getindex)));
    }
    else if EQ("tostring") {
      const char *s = lua_tostring(L1, getindex);
      const char *s1 = lua_pushstring(L1, s);
      lua_longassert((s == NULL && s1 == NULL) || strcmp(s, s1) == 0);
    }
    else if EQ("type") {
      lua_pushstring(L1, luaL_typename(L1, getnum));
    }
    else if EQ("xmove") {
      int f = getindex;
      int t = getindex;
      lua_State *fs = (f == 0) ? L1 : lua_tothread(L1, f);
      lua_State *ts = (t == 0) ? L1 : lua_tothread(L1, t);
      int n = getnum;
      if (n == 0) n = lua_gettop(fs);
      lua_xmove(fs, ts, n);
    }
    else if EQ("yield") {
      return lua_yield(L1, getnum);
    }
    else if EQ("yieldk") {
      int nres = getnum;
      int i = getindex;
      return lua_yieldk(L1, nres, i, Cfunck);
    }
    else luaL_error(L, "unknown instruction %s", buff);
  }
  return 0;
}